

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Clara::Detail::convertInto(string *_source,bool *_dest)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char *local_68;
  char *local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_38 [8];
  string sourceLC;
  bool *_dest_local;
  string *_source_local;
  
  sourceLC.field_2._8_8_ = _dest;
  std::__cxx11::string::string((string *)local_38,(string *)_source);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48._M_current = (char *)std::__cxx11::string::end();
  local_50 = (char *)std::__cxx11::string::begin();
  local_68 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (local_40,local_48,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_50,tolower);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"y");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"1");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"true");
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"yes");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"on");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"n");
            if (!bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"0");
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,"false");
                if (!bVar1) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"no");
                  if (!bVar1) {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"off");
                    if (!bVar1) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_a8,
                                     "Expected a boolean value but did not recognise:\n  \'",_source
                                    );
                      std::operator+(&local_88,&local_a8,"\'");
                      std::runtime_error::runtime_error(this,(string *)&local_88);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                }
              }
            }
            *(undefined1 *)sourceLC.field_2._8_8_ = 0;
            goto LAB_002a6c63;
          }
        }
      }
    }
  }
  *(undefined1 *)sourceLC.field_2._8_8_ = 1;
LAB_002a6c63:
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

inline void convertInto( std::string const& _source, bool& _dest ) {
            std::string sourceLC = _source;
            std::transform( sourceLC.begin(), sourceLC.end(), sourceLC.begin(), ::tolower );
            if( sourceLC == "y" || sourceLC == "1" || sourceLC == "true" || sourceLC == "yes" || sourceLC == "on" )
                _dest = true;
            else if( sourceLC == "n" || sourceLC == "0" || sourceLC == "false" || sourceLC == "no" || sourceLC == "off" )
                _dest = false;
            else
                throw std::runtime_error( "Expected a boolean value but did not recognise:\n  '" + _source + "'" );
        }